

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeIdentifier
          (ParserImpl *this,string *identifier)

{
  TokenType TVar1;
  allocator<char> local_39;
  string local_38;
  
  TVar1 = (this->tokenizer_).current_.type;
  if (TVar1 == TYPE_IDENTIFIER) {
    std::__cxx11::string::_M_assign((string *)identifier);
    io::Tokenizer::Next(&this->tokenizer_);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Expected identifier.",&local_39);
    ReportError(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return TVar1 == TYPE_IDENTIFIER;
}

Assistant:

bool ConsumeIdentifier(string* identifier) {
    if (!LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
      ReportError("Expected identifier.");
      return false;
    }

    *identifier = tokenizer_.current().text;

    tokenizer_.Next();
    return true;
  }